

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

EVstone INT_REVcreate_stone_action(CMConnection conn,char *action_spec)

{
  int condition;
  CMFormat format;
  EVcreate_stone_action_request request;
  EV_int_response response;
  undefined8 local_38;
  char *pcStack_30;
  undefined1 local_28 [4];
  EVstone local_24;
  
  local_38 = 0;
  pcStack_30 = (char *)0x0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVcreate_stone_action_req_formats);
  local_38 = CONCAT44(local_38._4_4_,condition);
  pcStack_30 = action_spec;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVcreate_stone_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_28);
  INT_CMwrite(conn,format,&local_38);
  INT_CMCondition_wait(conn->cm,condition);
  return local_24;
}

Assistant:

extern EVstone
INT_REVcreate_stone_action(CMConnection conn, char *action_spec)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVcreate_stone_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVcreate_stone_action_req_formats);
    request.action_spec = action_spec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVcreate_stone_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}